

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

optional<ParsedGame> *
Parser::parse_from_string
          (optional<ParsedGame> *__return_storage_ptr__,string *p_text,
          shared_ptr<PSLogger> *p_logger)

{
  pointer pcVar1;
  TextProviderString *this;
  _Head_base<0UL,_TextProvider_*,_false> local_70;
  shared_ptr<PSLogger> local_68;
  shared_ptr<PSLogger> local_58;
  string local_48;
  
  this = (TextProviderString *)operator_new(0x58);
  local_58.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (p_logger->super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (p_logger->super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_58.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_58.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_58.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  pcVar1 = (p_text->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + p_text->_M_string_length);
  TextProviderString::TextProviderString(this,&local_58,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_58.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_68.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (p_logger->super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_68.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (p_logger->super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_68.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_68.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_68.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  local_70._M_head_impl = (TextProvider *)this;
  parse_from_text_provider
            (__return_storage_ptr__,
             (unique_ptr<TextProvider,_std::default_delete<TextProvider>_> *)&local_70,&local_68);
  if (local_68.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if ((TextProviderString *)local_70._M_head_impl != (TextProviderString *)0x0) {
    (*((TextProvider *)&(local_70._M_head_impl)->_vptr_TextProvider)->_vptr_TextProvider[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<ParsedGame> Parser::parse_from_string(string p_text, shared_ptr<PSLogger> p_logger)
{
	unique_ptr<TextProvider> txt_provider(new TextProviderString(p_logger,p_text));
	return parse_from_text_provider(move(txt_provider),p_logger);
}